

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry_link_resolver.c
# Opt level: O0

void archive_entry_linkify(archive_entry_linkresolver *res,archive_entry **e,archive_entry **f)

{
  archive_entry *paVar1;
  uint uVar2;
  mode_t mVar3;
  links_entry_conflict *plVar4;
  char *pcVar5;
  archive_entry *t;
  links_entry_conflict *le;
  archive_entry **f_local;
  archive_entry **e_local;
  archive_entry_linkresolver *res_local;
  
  *f = (archive_entry *)0x0;
  if (*e == (archive_entry *)0x0) {
    plVar4 = next_entry(res,1);
    if (plVar4 != (links_entry_conflict *)0x0) {
      *e = plVar4->entry;
      plVar4->entry = (archive_entry *)0x0;
    }
  }
  else {
    uVar2 = archive_entry_nlink(*e);
    if ((((uVar2 != 1) && (mVar3 = archive_entry_filetype(*e), mVar3 != 0x4000)) &&
        (mVar3 = archive_entry_filetype(*e), mVar3 != 0x6000)) &&
       (mVar3 = archive_entry_filetype(*e), mVar3 != 0x2000)) {
      switch(res->strategy) {
      case 0:
        plVar4 = find_entry(res,*e);
        if (plVar4 == (links_entry_conflict *)0x0) {
          insert_entry(res,*e);
        }
        else {
          archive_entry_unset_size(*e);
          paVar1 = *e;
          pcVar5 = archive_entry_pathname(plVar4->canonical);
          archive_entry_copy_hardlink(paVar1,pcVar5);
        }
        break;
      case 1:
        plVar4 = find_entry(res,*e);
        if (plVar4 == (links_entry_conflict *)0x0) {
          insert_entry(res,*e);
        }
        else {
          paVar1 = *e;
          pcVar5 = archive_entry_pathname(plVar4->canonical);
          archive_entry_copy_hardlink(paVar1,pcVar5);
        }
        break;
      case 2:
        break;
      case 3:
        plVar4 = find_entry(res,*e);
        if (plVar4 == (links_entry_conflict *)0x0) {
          plVar4 = insert_entry(res,*e);
          if (plVar4 != (links_entry_conflict *)0x0) {
            plVar4->entry = *e;
            *e = (archive_entry *)0x0;
          }
        }
        else {
          paVar1 = *e;
          *e = plVar4->entry;
          plVar4->entry = paVar1;
          archive_entry_unset_size(*e);
          paVar1 = *e;
          pcVar5 = archive_entry_pathname(plVar4->canonical);
          archive_entry_copy_hardlink(paVar1,pcVar5);
          if (plVar4->links == 0) {
            *f = plVar4->entry;
            plVar4->entry = (archive_entry *)0x0;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
archive_entry_linkify(struct archive_entry_linkresolver *res,
    struct archive_entry **e, struct archive_entry **f)
{
	struct links_entry *le;
	struct archive_entry *t;

	*f = NULL; /* Default: Don't return a second entry. */

	if (*e == NULL) {
		le = next_entry(res, NEXT_ENTRY_DEFERRED);
		if (le != NULL) {
			*e = le->entry;
			le->entry = NULL;
		}
		return;
	}

	/* If it has only one link, then we're done. */
	if (archive_entry_nlink(*e) == 1)
		return;
	/* Directories, devices never have hardlinks. */
	if (archive_entry_filetype(*e) == AE_IFDIR
	    || archive_entry_filetype(*e) == AE_IFBLK
	    || archive_entry_filetype(*e) == AE_IFCHR)
		return;

	switch (res->strategy) {
	case ARCHIVE_ENTRY_LINKIFY_LIKE_TAR:
		le = find_entry(res, *e);
		if (le != NULL) {
			archive_entry_unset_size(*e);
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
		} else
			insert_entry(res, *e);
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_MTREE:
		le = find_entry(res, *e);
		if (le != NULL) {
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
		} else
			insert_entry(res, *e);
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_OLD_CPIO:
		/* This one is trivial. */
		return;
	case ARCHIVE_ENTRY_LINKIFY_LIKE_NEW_CPIO:
		le = find_entry(res, *e);
		if (le != NULL) {
			/*
			 * Put the new entry in le, return the
			 * old entry from le.
			 */
			t = *e;
			*e = le->entry;
			le->entry = t;
			/* Make the old entry into a hardlink. */
			archive_entry_unset_size(*e);
			archive_entry_copy_hardlink(*e,
			    archive_entry_pathname(le->canonical));
			/* If we ran out of links, return the
			 * final entry as well. */
			if (le->links == 0) {
				*f = le->entry;
				le->entry = NULL;
			}
		} else {
			/*
			 * If we haven't seen it, tuck it away
			 * for future use.
			 */
			le = insert_entry(res, *e);
			if (le == NULL)
				/* XXX We should return an error code XXX */
				return;
			le->entry = *e;
			*e = NULL;
		}
		return;
	default:
		break;
	}
	return;
}